

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall despot::Parser::PrintAction(Parser *this,ACT_TYPE action,ostream *out)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<(out,action);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = std::operator<<(poVar1,(string *)
                                  ((long)action * 0x20 +
                                  *(long *)&(((this->action_vars_).
                                              super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super_Variable).values_.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data));
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Parser::PrintAction(ACT_TYPE action, ostream& out) const {
	out << action << ":" << action_vars_[0].GetValue(action) << endl;
}